

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_reader.c
# Opt level: O1

uint16_t aom_read_primitive_refsubexpfin_(aom_reader *r,uint16_t n,uint16_t k,uint16_t ref)

{
  int iVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint16_t uVar8;
  uint uVar9;
  undefined6 in_register_00000012;
  int mk;
  int iVar10;
  ulong unaff_RBP;
  undefined6 in_register_00000032;
  od_ec_dec *dec;
  int iVar11;
  int i;
  int iVar12;
  
  iVar1 = (int)CONCAT62(in_register_00000012,k);
  dec = &r->ec;
  iVar10 = 0;
  iVar12 = 0;
  do {
    iVar11 = iVar1 + -1 + iVar12;
    if (iVar12 == 0) {
      iVar11 = iVar1;
    }
    uVar7 = (uint)CONCAT62(in_register_00000032,n);
    if ((3 << ((byte)iVar11 & 0x1f)) + iVar10 < (int)uVar7) {
      iVar4 = od_ec_decode_bool_q15(dec,0x4000);
      if (iVar4 == 0) {
        if (iVar11 < 1) {
          uVar9 = 0;
        }
        else {
          iVar11 = iVar12 + (uint)(iVar12 == 0) + iVar1;
          uVar9 = 0;
          do {
            iVar4 = od_ec_decode_bool_q15(dec,0x4000);
            uVar9 = uVar9 | iVar4 << ((char)iVar11 - 2U & 0x1f);
            iVar11 = iVar11 + -1;
          } while (1 < iVar11);
        }
        unaff_RBP = (ulong)(uVar9 + iVar10);
        bVar3 = false;
      }
      else {
        iVar12 = iVar12 + 1;
        iVar10 = iVar10 + (1 << ((byte)iVar11 & 0x1f));
        bVar3 = true;
      }
    }
    else {
      uVar9 = 0;
      if (1 < (ushort)(uVar7 - iVar10)) {
        uVar5 = uVar7 - iVar10 & 0xffff;
        iVar11 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar11 == 0; iVar11 = iVar11 + -1) {
          }
        }
        if (iVar11 != 0) {
          iVar4 = iVar11 + 1;
          uVar9 = 0;
          do {
            iVar6 = od_ec_decode_bool_q15(dec,0x4000);
            uVar9 = uVar9 | iVar6 << ((char)iVar4 - 2U & 0x1f);
            iVar4 = iVar4 + -1;
          } while (1 < iVar4);
        }
        iVar11 = (2 << ((byte)iVar11 & 0x1f)) - uVar5;
        if (iVar11 <= (int)uVar9) {
          iVar4 = od_ec_decode_bool_q15(dec,0x4000);
          uVar9 = (uVar9 * 2 - iVar11) + iVar4;
        }
      }
      unaff_RBP = (ulong)(uVar9 + iVar10);
      bVar3 = false;
    }
    uVar8 = (uint16_t)unaff_RBP;
  } while (bVar3);
  uVar9 = (uint)ref * 2;
  if (uVar7 < uVar9) {
    uVar9 = (uVar7 - 1) - (uint)ref;
    uVar5 = (uint)(unaff_RBP & 0xffff);
    if (uVar5 <= (uVar9 & 0xffff) * 2) {
      if ((unaff_RBP & 1) == 0) {
        sVar2 = (short)((unaff_RBP & 0xffff) >> 1);
      }
      else {
        sVar2 = -(short)(uVar5 + 1 >> 1);
      }
      uVar8 = (short)uVar9 + sVar2;
    }
    uVar8 = (short)(uVar7 - 1) - uVar8;
  }
  else {
    uVar7 = (uint)(unaff_RBP & 0xffff);
    if (uVar7 <= uVar9) {
      if ((unaff_RBP & 1) == 0) {
        sVar2 = (short)((unaff_RBP & 0xffff) >> 1);
      }
      else {
        sVar2 = -(short)(uVar7 + 1 >> 1);
      }
      uVar8 = ref + sVar2;
    }
  }
  return uVar8;
}

Assistant:

uint16_t aom_read_primitive_refsubexpfin_(aom_reader *r, uint16_t n, uint16_t k,
                                          uint16_t ref ACCT_STR_PARAM) {
  return inv_recenter_finite_nonneg(
      n, ref, read_primitive_subexpfin(r, n, k, ACCT_STR_NAME));
}